

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

void QConcatenable<QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>_>
     ::appendTo<QChar>(type *p,QChar **out)

{
  size_t in_RCX;
  void *__buf;
  
  QConcatenable<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>_>::appendTo<QChar>
            (&p->a,out);
  HexString<unsigned_char>::write(&p->b,(int)out,__buf,in_RCX);
  return;
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }